

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O0

void Ins_IF(TT_ExecContext exc,FT_Long *args)

{
  FT_Byte FVar1;
  FT_Bool FVar2;
  bool bVar3;
  int local_1c;
  FT_Bool Out;
  FT_Int nIfs;
  FT_Long *args_local;
  TT_ExecContext exc_local;
  
  if (*args == 0) {
    local_1c = 1;
    bVar3 = false;
    do {
      FVar2 = SkipCode(exc);
      if (FVar2 == '\x01') {
        return;
      }
      FVar1 = exc->opcode;
      if (FVar1 == '\x1b') {
        bVar3 = local_1c == 1;
      }
      else if (FVar1 == 'X') {
        local_1c = local_1c + 1;
      }
      else if (FVar1 == 'Y') {
        local_1c = local_1c + -1;
        bVar3 = local_1c == 0;
      }
    } while (!bVar3);
  }
  return;
}

Assistant:

static void
  Ins_IF( TT_ExecContext  exc,
          FT_Long*        args )
  {
    FT_Int   nIfs;
    FT_Bool  Out;


    if ( args[0] != 0 )
      return;

    nIfs = 1;
    Out = 0;

    do
    {
      if ( SkipCode( exc ) == FAILURE )
        return;

      switch ( exc->opcode )
      {
      case 0x58:      /* IF */
        nIfs++;
        break;

      case 0x1B:      /* ELSE */
        Out = FT_BOOL( nIfs == 1 );
        break;

      case 0x59:      /* EIF */
        nIfs--;
        Out = FT_BOOL( nIfs == 0 );
        break;
      }
    } while ( Out == 0 );
  }